

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O3

_Bool clone_ssl_primary_config(ssl_primary_config *source,ssl_primary_config *dest)

{
  byte bVar1;
  curl_blob *pcVar2;
  size_t sVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  _Bool _Var7;
  curl_blob *pcVar8;
  char *pcVar9;
  
  dest->version = source->version;
  dest->version_max = source->version_max;
  bVar4 = source->field_0x79 & 1;
  bVar1 = dest->field_0x79;
  dest->field_0x79 = bVar1 & 0xfe | bVar4;
  bVar5 = source->field_0x79 & 2;
  dest->field_0x79 = bVar1 & 0xfc | bVar4 | bVar5;
  bVar6 = source->field_0x79 & 4;
  dest->field_0x79 = bVar1 & 0xf8 | bVar4 | bVar5 | bVar6;
  dest->field_0x79 = bVar1 & 0xf0 | bVar4 | bVar5 | bVar6 | source->field_0x79 & 8;
  dest->ssl_options = source->ssl_options;
  pcVar2 = source->cert_blob;
  if (pcVar2 == (curl_blob *)0x0) {
LAB_0016b9b5:
    pcVar2 = source->ca_info_blob;
    if (pcVar2 != (curl_blob *)0x0) {
      pcVar8 = (curl_blob *)(*Curl_cmalloc)(pcVar2->len + 0x18);
      if (pcVar8 == (curl_blob *)0x0) goto LAB_0016bbf0;
      sVar3 = pcVar2->len;
      pcVar8->len = sVar3;
      pcVar8->flags = 1;
      pcVar8->data = pcVar8 + 1;
      memcpy(pcVar8 + 1,pcVar2->data,sVar3);
      dest->ca_info_blob = pcVar8;
    }
    pcVar2 = source->issuercert_blob;
    if (pcVar2 != (curl_blob *)0x0) {
      pcVar8 = (curl_blob *)(*Curl_cmalloc)(pcVar2->len + 0x18);
      if (pcVar8 == (curl_blob *)0x0) goto LAB_0016bbf0;
      sVar3 = pcVar2->len;
      pcVar8->len = sVar3;
      pcVar8->flags = 1;
      pcVar8->data = pcVar8 + 1;
      memcpy(pcVar8 + 1,pcVar2->data,sVar3);
      dest->issuercert_blob = pcVar8;
    }
    if (source->CApath == (char *)0x0) {
      dest->CApath = (char *)0x0;
    }
    else {
      pcVar9 = (*Curl_cstrdup)(source->CApath);
      dest->CApath = pcVar9;
      if (pcVar9 == (char *)0x0) goto LAB_0016bbf0;
    }
    if (source->CAfile == (char *)0x0) {
      dest->CAfile = (char *)0x0;
    }
    else {
      pcVar9 = (*Curl_cstrdup)(source->CAfile);
      dest->CAfile = pcVar9;
      if (pcVar9 == (char *)0x0) goto LAB_0016bbf0;
    }
    if (source->issuercert == (char *)0x0) {
      dest->issuercert = (char *)0x0;
    }
    else {
      pcVar9 = (*Curl_cstrdup)(source->issuercert);
      dest->issuercert = pcVar9;
      if (pcVar9 == (char *)0x0) goto LAB_0016bbf0;
    }
    if (source->clientcert == (char *)0x0) {
      dest->clientcert = (char *)0x0;
    }
    else {
      pcVar9 = (*Curl_cstrdup)(source->clientcert);
      dest->clientcert = pcVar9;
      if (pcVar9 == (char *)0x0) goto LAB_0016bbf0;
    }
    if (source->cipher_list == (char *)0x0) {
      dest->cipher_list = (char *)0x0;
    }
    else {
      pcVar9 = (*Curl_cstrdup)(source->cipher_list);
      dest->cipher_list = pcVar9;
      if (pcVar9 == (char *)0x0) goto LAB_0016bbf0;
    }
    if (source->cipher_list13 == (char *)0x0) {
      dest->cipher_list13 = (char *)0x0;
    }
    else {
      pcVar9 = (*Curl_cstrdup)(source->cipher_list13);
      dest->cipher_list13 = pcVar9;
      if (pcVar9 == (char *)0x0) goto LAB_0016bbf0;
    }
    if (source->pinned_key == (char *)0x0) {
      dest->pinned_key = (char *)0x0;
    }
    else {
      pcVar9 = (*Curl_cstrdup)(source->pinned_key);
      dest->pinned_key = pcVar9;
      if (pcVar9 == (char *)0x0) goto LAB_0016bbf0;
    }
    if (source->curves == (char *)0x0) {
      dest->curves = (char *)0x0;
    }
    else {
      pcVar9 = (*Curl_cstrdup)(source->curves);
      dest->curves = pcVar9;
      if (pcVar9 == (char *)0x0) goto LAB_0016bbf0;
    }
    if (source->CRLfile == (char *)0x0) {
      dest->CRLfile = (char *)0x0;
    }
    else {
      pcVar9 = (*Curl_cstrdup)(source->CRLfile);
      dest->CRLfile = pcVar9;
      if (pcVar9 == (char *)0x0) goto LAB_0016bbf0;
    }
    if (source->username == (char *)0x0) {
      dest->username = (char *)0x0;
    }
    else {
      pcVar9 = (*Curl_cstrdup)(source->username);
      dest->username = pcVar9;
      if (pcVar9 == (char *)0x0) goto LAB_0016bbf0;
    }
    if (source->password == (char *)0x0) {
      dest->password = (char *)0x0;
    }
    else {
      pcVar9 = (*Curl_cstrdup)(source->password);
      dest->password = pcVar9;
      if (pcVar9 == (char *)0x0) goto LAB_0016bbf0;
    }
    _Var7 = true;
  }
  else {
    pcVar8 = (curl_blob *)(*Curl_cmalloc)(pcVar2->len + 0x18);
    if (pcVar8 != (curl_blob *)0x0) {
      sVar3 = pcVar2->len;
      pcVar8->len = sVar3;
      pcVar8->flags = 1;
      pcVar8->data = pcVar8 + 1;
      memcpy(pcVar8 + 1,pcVar2->data,sVar3);
      dest->cert_blob = pcVar8;
      goto LAB_0016b9b5;
    }
LAB_0016bbf0:
    _Var7 = false;
  }
  return _Var7;
}

Assistant:

static bool clone_ssl_primary_config(struct ssl_primary_config *source,
                                     struct ssl_primary_config *dest)
{
  dest->version = source->version;
  dest->version_max = source->version_max;
  dest->verifypeer = source->verifypeer;
  dest->verifyhost = source->verifyhost;
  dest->verifystatus = source->verifystatus;
  dest->cache_session = source->cache_session;
  dest->ssl_options = source->ssl_options;

  CLONE_BLOB(cert_blob);
  CLONE_BLOB(ca_info_blob);
  CLONE_BLOB(issuercert_blob);
  CLONE_STRING(CApath);
  CLONE_STRING(CAfile);
  CLONE_STRING(issuercert);
  CLONE_STRING(clientcert);
  CLONE_STRING(cipher_list);
  CLONE_STRING(cipher_list13);
  CLONE_STRING(pinned_key);
  CLONE_STRING(curves);
  CLONE_STRING(CRLfile);
#ifdef USE_TLS_SRP
  CLONE_STRING(username);
  CLONE_STRING(password);
#endif

  return TRUE;
}